

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O0

int amqp_bytes_equal(amqp_bytes_t r,amqp_bytes_t l)

{
  int iVar1;
  void *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  size_t in_RDI;
  undefined4 local_4;
  
  if (in_RDI == in_RDX) {
    if (in_RSI != in_RCX) {
      iVar1 = memcmp(in_RSI,in_RCX,in_RDI);
      if (iVar1 != 0) goto LAB_00110d34;
    }
    local_4 = 1;
  }
  else {
LAB_00110d34:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int amqp_bytes_equal(amqp_bytes_t r, amqp_bytes_t l) {
  if (r.len == l.len &&
      (r.bytes == l.bytes || 0 == memcmp(r.bytes, l.bytes, r.len))) {
    return 1;
  }
  return 0;
}